

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_mp3_dr_callback__seek(void *pUserData,int offset,ma_dr_mp3_seek_origin origin)

{
  int iVar1;
  
  iVar1 = (**(code **)((long)pUserData + 0x50))
                    (*(undefined8 *)((long)pUserData + 0x60),(long)offset,
                     origin == ma_dr_mp3_seek_origin_current);
  return (ma_bool32)(iVar1 == 0);
}

Assistant:

static ma_bool32 ma_mp3_dr_callback__seek(void* pUserData, int offset, ma_dr_mp3_seek_origin origin)
{
    ma_mp3* pMP3 = (ma_mp3*)pUserData;
    ma_result result;
    ma_seek_origin maSeekOrigin;

    MA_ASSERT(pMP3 != NULL);

    maSeekOrigin = ma_seek_origin_start;
    if (origin == ma_dr_mp3_seek_origin_current) {
        maSeekOrigin =  ma_seek_origin_current;
    }

    result = pMP3->onSeek(pMP3->pReadSeekTellUserData, offset, maSeekOrigin);
    if (result != MA_SUCCESS) {
        return MA_FALSE;
    }

    return MA_TRUE;
}